

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  _xmlSAXHandler *p_Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  undefined4 extraout_var;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  cdataBlockSAXFunc p_Var8;
  xmlChar xVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int l;
  int sl;
  int rl;
  ulong local_50;
  ulong local_48;
  xmlChar *local_40;
  long local_38;
  
  uVar13 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar13 = 10000000;
  }
  pxVar5 = ctxt->input;
  pxVar6 = pxVar5->cur;
  if (*pxVar6 != '<') {
    return;
  }
  if (pxVar6[1] != '!') {
    return;
  }
  if (pxVar6[2] != '[') {
    return;
  }
  pxVar7 = pxVar6 + 3;
  pxVar5->cur = pxVar7;
  pxVar5->col = pxVar5->col + 3;
  xVar9 = pxVar6[3];
  if (xVar9 == '\0') {
    xmlParserGrow(ctxt);
    pxVar5 = ctxt->input;
    pxVar7 = pxVar5->cur;
    xVar9 = *pxVar7;
  }
  if (xVar9 != 'C') {
    return;
  }
  if (pxVar7[1] != 'D') {
    return;
  }
  if (pxVar7[2] != 'A') {
    return;
  }
  if (pxVar7[3] != 'T') {
    return;
  }
  if (pxVar7[4] != 'A') {
    return;
  }
  if (pxVar7[5] != '[') {
    return;
  }
  pxVar5->cur = pxVar7 + 6;
  pxVar5->col = pxVar5->col + 6;
  if (pxVar7[6] == '\0') {
    xmlParserGrow(ctxt);
  }
  uVar2 = xmlCurrentCharRecover(ctxt,&rl);
  uVar16 = (ulong)uVar2;
  if ((int)uVar2 < 0x100) {
    if ((0x1f < (int)uVar2) || ((uVar2 < 0xe && ((0x2600U >> (uVar2 & 0x1f) & 1) != 0)))) {
LAB_0013aefa:
      pxVar5 = ctxt->input;
      if (*pxVar5->cur == '\n') {
        pxVar5->line = pxVar5->line + 1;
        pxVar5->col = 1;
      }
      else {
        pxVar5->col = pxVar5->col + 1;
      }
      pxVar5->cur = pxVar5->cur + rl;
      uVar2 = xmlCurrentCharRecover(ctxt,&sl);
      if ((int)uVar2 < 0x100) {
        if ((0x1f < (int)uVar2) || ((uVar2 < 0xe && ((0x2600U >> (uVar2 & 0x1f) & 1) != 0)))) {
LAB_0013af50:
          pxVar5 = ctxt->input;
          if (*pxVar5->cur == '\n') {
            pxVar5->line = pxVar5->line + 1;
            pxVar5->col = 1;
          }
          else {
            pxVar5->col = pxVar5->col + 1;
          }
          pxVar5->cur = pxVar5->cur + sl;
          iVar3 = xmlCurrentCharRecover(ctxt,&l);
          local_48 = CONCAT44(extraout_var,iVar3);
          pxVar6 = (xmlChar *)(*xmlMalloc)(100);
          if (pxVar6 != (xmlChar *)0x0) {
            iVar3 = 0;
            uVar10 = local_48;
            uVar11 = 100;
            uVar14 = (ulong)uVar2;
            do {
              lVar12 = (long)iVar3;
              uVar2 = (uint)uVar10;
              if ((int)uVar2 < 0x100) {
                if (((int)uVar2 < 0x20) && ((0xd < uVar2 || ((0x2600U >> (uVar2 & 0x1f) & 1) == 0)))
                   ) {
LAB_0013b180:
                  pxVar6[lVar12] = '\0';
                  xmlFatalErrMsgStr(ctxt,XML_ERR_CDATA_NOT_FINISHED,
                                    "CData section not finished\n%.50s\n",pxVar6);
                  goto LAB_0013b206;
                }
              }
              else if (0xfffff < uVar2 - 0x10000 && (0x1ffd < uVar2 - 0xe000 && 0xd7ff < uVar2))
              goto LAB_0013b180;
              if (uVar2 == 0x3e && ((int)uVar14 == 0x5d && (int)uVar16 == 0x5d)) {
                pxVar6[lVar12] = '\0';
                pxVar5 = ctxt->input;
                if (*pxVar5->cur == '\n') {
                  pxVar5->line = pxVar5->line + 1;
                  pxVar5->col = 1;
                }
                else {
                  pxVar5->col = pxVar5->col + 1;
                }
                pxVar5->cur = pxVar5->cur + l;
                p_Var1 = ctxt->sax;
                if ((p_Var1 != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
                  if ((ctxt->options & 0x4000) == 0) {
                    p_Var8 = p_Var1->cdataBlock;
                  }
                  else {
                    p_Var8 = p_Var1->characters;
                  }
                  if (p_Var8 != (cdataBlockSAXFunc)0x0) {
                    (*p_Var8)(ctxt->userData,pxVar6,iVar3);
                  }
                }
                goto LAB_0013b206;
              }
              iVar4 = (int)uVar11;
              pxVar7 = pxVar6;
              local_50 = uVar16;
              if (iVar4 <= iVar3 + 5) {
                uVar2 = 1;
                local_38 = lVar12;
                if (0 < iVar4) {
                  if ((int)uVar13 <= iVar4) {
                    xmlFatalErrMsg(ctxt,XML_ERR_CDATA_NOT_FINISHED,"CData section too big found\n");
                    goto LAB_0013b206;
                  }
                  uVar15 = iVar4 + 1U >> 1;
                  uVar2 = uVar15 + iVar4;
                  if ((int)(uVar13 - uVar15) < iVar4) {
                    uVar2 = uVar13;
                  }
                }
                local_40 = pxVar6;
                pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)uVar2);
                pxVar6 = local_40;
                uVar11 = (ulong)uVar2;
                lVar12 = local_38;
                if (pxVar7 == (xmlChar *)0x0) goto LAB_0013b1ce;
              }
              uVar2 = (uint)local_50;
              local_48 = uVar10;
              if (uVar2 < 0x80) {
                iVar3 = iVar3 + 1;
                pxVar7[lVar12] = (xmlChar)local_50;
                local_50 = uVar11;
              }
              else {
                local_50 = uVar11;
                iVar4 = xmlCopyCharMultiByte(pxVar7 + lVar12,uVar2);
                iVar3 = iVar4 + iVar3;
              }
              rl = sl;
              sl = l;
              pxVar5 = ctxt->input;
              if (*pxVar5->cur == '\n') {
                pxVar5->line = pxVar5->line + 1;
                pxVar5->col = 1;
              }
              else {
                pxVar5->col = pxVar5->col + 1;
              }
              pxVar5->cur = pxVar5->cur + l;
              uVar2 = xmlCurrentCharRecover(ctxt,&l);
              uVar16 = uVar14 & 0xffffffff;
              uVar10 = (ulong)uVar2;
              uVar11 = local_50;
              pxVar6 = pxVar7;
              uVar14 = local_48;
            } while( true );
          }
          xmlCtxtErrMemory(ctxt);
          pxVar6 = (xmlChar *)0x0;
          goto LAB_0013b206;
        }
      }
      else if (uVar2 - 0x10000 < 0x100000 || (uVar2 - 0xe000 < 0x1ffe || uVar2 < 0xd800))
      goto LAB_0013af50;
    }
  }
  else if (uVar2 - 0x10000 < 0x100000 || (uVar2 - 0xe000 < 0x1ffe || uVar2 < 0xd800))
  goto LAB_0013aefa;
  pxVar6 = (xmlChar *)0x0;
  xmlFatalErr(ctxt,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
LAB_0013b206:
  (*xmlFree)(pxVar6);
  return;
LAB_0013b1ce:
  xmlCtxtErrMemory(ctxt);
  goto LAB_0013b206;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if ((CUR != '<') || (NXT(1) != '!') || (NXT(2) != '['))
        return;
    SKIP(3);

    if (!CMP6(CUR_PTR, 'C', 'D', 'A', 'T', 'A', '['))
        return;
    SKIP(6);

    r = xmlCurrentCharRecover(ctxt, &rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(rl);
    s = xmlCurrentCharRecover(ctxt, &sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(sl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
        goto out;
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsg(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                               "CData section too big found\n");
                goto out;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
                goto out;
	    }
	    buf = tmp;
	    size = newSize;
	}
	COPY_BUF(buf, len, r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
        goto out;
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        if (ctxt->options & XML_PARSE_NOCDATA) {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, len);
        } else {
            if (ctxt->sax->cdataBlock != NULL)
                ctxt->sax->cdataBlock(ctxt->userData, buf, len);
        }
    }

out:
    xmlFree(buf);
}